

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archivable_dictionary.cpp
# Opt level: O0

bool __thiscall
ON_ArchivableDictionaryPrivate::TrySetValue<ON_SimpleArray<bool>>
          (ON_ArchivableDictionaryPrivate *this,wchar_t *key,ON_SimpleArray<bool> *value)

{
  undefined8 src;
  int iVar1;
  pointer ppVar2;
  pointer pDVar3;
  DictionaryEntryT<ON_SimpleArray<bool>,_(DictionaryEntryType)13> *this_00;
  reference this_01;
  pair<std::_Rb_tree_iterator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>,_bool>
  pVar4;
  undefined1 local_80 [16];
  unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_> *entry_ptr;
  undefined1 local_68;
  void *local_50;
  pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>
  local_48;
  _Rb_tree_iterator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>
  local_38;
  pair<std::_Rb_tree_iterator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>,_bool>
  r;
  ON_SimpleArray<bool> *value_local;
  wchar_t *key_local;
  ON_ArchivableDictionaryPrivate *this_local;
  
  local_50 = (void *)0x0;
  r._8_8_ = value;
  value_local = (ON_SimpleArray<bool> *)key;
  key_local = (wchar_t *)this;
  std::
  pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>::
  pair<const_wchar_t_*&,_std::nullptr_t,_true>(&local_48,(wchar_t **)&value_local,&local_50);
  pVar4 = std::
          map<ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>,_std::less<void>,_std::allocator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>_>
          ::insert(&this->m_map,&local_48);
  entry_ptr = (unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_> *)
              pVar4.first._M_node;
  local_68 = pVar4.second;
  local_38._M_node = (_Base_ptr)entry_ptr;
  r.first._M_node._0_1_ = local_68;
  std::
  pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>::
  ~pair(&local_48);
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>
           ::operator->(&local_38);
  local_80._8_8_ = &ppVar2->second;
  if (((byte)r.first._M_node & 1) == 0) {
    pDVar3 = std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>::operator->
                       ((unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_> *)
                        local_80._8_8_);
    iVar1 = (*pDVar3->_vptr_DictionaryEntry[2])();
    src = r._8_8_;
    if (iVar1 == 0xd) {
      this_00 = (DictionaryEntryT<ON_SimpleArray<bool>,_(DictionaryEntryType)13> *)
                std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>::get
                          ((unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_> *)
                           local_80._8_8_);
      this_01 = DictionaryEntryT<ON_SimpleArray<bool>,_(DictionaryEntryType)13>::Value(this_00);
      ON_SimpleArray<bool>::operator=(this_01,(ON_SimpleArray<bool> *)src);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    make_entry<ON_SimpleArray<bool>>((ON_SimpleArray<bool> *)local_80);
    std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>::operator=
              ((unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>> *)local_80._8_8_,
               (unique_ptr<Entry<ON_SimpleArray<bool>_>,_std::default_delete<Entry<ON_SimpleArray<bool>_>_>_>
                *)local_80);
    std::
    unique_ptr<Entry<ON_SimpleArray<bool>_>,_std::default_delete<Entry<ON_SimpleArray<bool>_>_>_>::
    ~unique_ptr((unique_ptr<Entry<ON_SimpleArray<bool>_>,_std::default_delete<Entry<ON_SimpleArray<bool>_>_>_>
                 *)local_80);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool TrySetValue(const wchar_t* key, const V& value)
  {
    auto r = m_map.insert({ key, nullptr });
    auto& entry_ptr = r.first->second;

    if (r.second)
    {
      entry_ptr = make_entry(value);
      return true;
    }
    else if (entry_ptr->EntryType() == Entry<V>::Type)
    {
      static_cast<Entry<V>*>(entry_ptr.get())->Value() = value;
      return true;
    }

    return false;
  }